

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O0

void __thiscall Buffer_change_event_remove_Test::TestBody(Buffer_change_event_remove_Test *this)

{
  initializer_list<bfy_changed_cb_info> __l;
  size_t len;
  bool bVar1;
  char *pcVar2;
  pointer setme;
  AssertHelper local_690;
  Message local_688;
  allocator<bfy_changed_cb_info> local_679;
  bfy_changed_cb_info local_678;
  iterator local_658;
  size_type local_650;
  vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> local_648;
  undefined1 local_630 [8];
  AssertionResult gtest_ar_2;
  Message local_618;
  size_t local_610;
  undefined1 local_608 [8];
  AssertionResult gtest_ar_1;
  bfy_changed_cb_info expected;
  BufferWithReadonlyStrings mabel;
  size_t n;
  size_t i;
  Message local_508 [3];
  size_t local_4f0;
  int local_4e4;
  undefined1 local_4e0 [8];
  AssertionResult gtest_ar;
  BufferWithReadonlyStrings local;
  array<char,_1024UL> array;
  Buffer_change_event_remove_Test *this_local;
  
  memset(&local.changes.
          super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage,0,0x400);
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::BufferWithReadonlyStrings
            ((BufferWithReadonlyStrings *)&gtest_ar.message_);
  local_4e4 = 1;
  local_4f0 = anon_unknown.dwarf_16b2d::buffer_count_pages
                        ((bfy_buffer *)&gtest_ar.message_,0xffffffffffffffff);
  testing::internal::CmpHelperLT<int,unsigned_long>
            ((internal *)local_4e0,"1","buffer_count_pages(&local.buf)",&local_4e4,&local_4f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e0);
  if (!bVar1) {
    testing::Message::Message(local_508);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&i,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x5dc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&i,local_508);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i);
    testing::Message::~Message(local_508);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e0);
  n = 1;
  mabel.changes.super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)bfy_buffer_get_content_len((bfy_buffer *)&gtest_ar.message_);
  for (; n < mabel.changes.
             super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage; n = n + 1) {
    anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::BufferWithReadonlyStrings
              ((BufferWithReadonlyStrings *)&expected.n_deleted);
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )mabel.changes.
             super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    expected.orig_size = 0;
    expected.n_added = n;
    anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::start_listening_to_changes
              ((BufferWithReadonlyStrings *)&expected.n_deleted);
    len = n;
    setme = std::data<std::array<char,1024ul>>
                      ((array<char,_1024UL> *)
                       &local.changes.
                        super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_610 = bfy_buffer_remove((bfy_buffer *)&expected.n_deleted,len,setme);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((EqHelper *)local_608,"i","bfy_buffer_remove(&mabel.buf, i, std::data(array))",&n,
               &local_610);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_608);
    if (!bVar1) {
      testing::Message::Message(&local_618);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_608);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
                 ,0x5e7,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_618);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_618);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_608);
    local_678.n_deleted = expected.n_added;
    local_678.orig_size =
         (size_t)gtest_ar_1.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
    local_678.n_added = expected.orig_size;
    local_658 = &local_678;
    local_650 = 1;
    std::allocator<bfy_changed_cb_info>::allocator(&local_679);
    __l._M_len = local_650;
    __l._M_array = local_658;
    std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>::vector
              (&local_648,__l,&local_679);
    testing::internal::EqHelper::
    Compare<std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>,_std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>,_nullptr>
              ((EqHelper *)local_630,"changes_t{expected}","mabel.changes",&local_648,
               (vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> *)
               ((long)&mabel.allstrs.field_2 + 8));
    std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>::~vector(&local_648);
    std::allocator<bfy_changed_cb_info>::~allocator(&local_679);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_630);
    if (!bVar1) {
      testing::Message::Message(&local_688);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_630);
      testing::internal::AssertHelper::AssertHelper
                (&local_690,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
                 ,0x5e8,pcVar2);
      testing::internal::AssertHelper::operator=(&local_690,&local_688);
      testing::internal::AssertHelper::~AssertHelper(&local_690);
      testing::Message::~Message(&local_688);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_630);
    anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::~BufferWithReadonlyStrings
              ((BufferWithReadonlyStrings *)&expected.n_deleted);
  }
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::~BufferWithReadonlyStrings
            ((BufferWithReadonlyStrings *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(Buffer, change_event_remove) {
    auto array = std::array<char, 1024> {};
    BufferWithReadonlyStrings const local;
    // confirm this test exercises removing <1, ==1, and >1 pages
    EXPECT_LT(1, buffer_count_pages(&local.buf));

    for (size_t i=1, n=bfy_buffer_get_content_len(&local.buf); i < n; ++i) {
        BufferWithReadonlyStrings mabel;
        auto const expected = bfy_changed_cb_info {
            .orig_size = n,
            .n_added = 0,
            .n_deleted = i
        };

        mabel.start_listening_to_changes();
        EXPECT_EQ(i, bfy_buffer_remove(&mabel.buf, i, std::data(array)));
        EXPECT_EQ(changes_t{expected}, mabel.changes);
    }
}